

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLVector3.cpp
# Opt level: O0

ostream * AML::operator<<(ostream *os,Vector3 *obj)

{
  ostream *poVar1;
  Vector3 *obj_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(obj->field_0).data[0]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(obj->field_0).data[1]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(obj->field_0).data[2]);
  std::operator<<(poVar1,"]");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Vector3& obj)
    {
        os << "[" << obj.x << ", " << obj.y << ", " << obj.z << "]";
        return os;
    }